

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::ReduceHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  Var pvVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var9;
  uint64 uVar10;
  uint64 uVar11;
  char16_t *pcVar12;
  ulong uVar13;
  ulong index;
  double value;
  undefined1 auVar14 [16];
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  Var local_38;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00bab444:
    pcVar12 = L"[TypedArray].prototype.reduce";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      pcVar12 = L"Array.prototype.reduce";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,pcVar12);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar3) goto LAB_00bab444;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar3) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
  }
  pvVar7 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    if (length == 0) {
      pcVar12 = L"TypedArray.prototype.reduce";
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        pcVar12 = L"Array.prototype.reduce";
      }
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea0b,pcVar12);
    }
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      bVar3 = false;
      local_38 = (Var)0x0;
      index = 0;
      do {
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar5 = JavascriptOperators::HasItem(obj,index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        if (BVar5 != 0) {
          *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_38 = JavascriptOperators::GetItem(obj,index,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          *(bool *)((long)local_70 + 0x108) = true;
          bVar3 = true;
        }
        index = index + 1;
      } while ((index < length) && (!bVar3));
      bVar3 = !bVar3;
    }
    else {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (!bVar3) {
        bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
        if (bVar3) {
LAB_00bab4cf:
          Throw::FatalInternalError(-0x7fffbffb);
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x277b,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (bVar3) {
          *puVar8 = 0;
          goto LAB_00bab4cf;
        }
        goto LAB_00bab583;
      }
      if ((typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length == 0) {
        bVar3 = true;
        index = 0;
        local_38 = (Var)0x0;
      }
      else {
        bVar3 = false;
        iVar6 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,0);
        local_38 = (Var)CONCAT44(extraout_var,iVar6);
        index = 1;
      }
    }
    if (bVar3) {
      pcVar12 = L"TypedArray.prototype.reduce";
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        pcVar12 = L"Array.prototype.reduce";
      }
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea0b,pcVar12);
    }
  }
  else {
    local_38 = Arguments::operator[](args,2);
    index = 0;
  }
  if (local_38 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27a2,"(accumulator)","accumulator");
    if (!bVar3) goto LAB_00bab583;
    *puVar8 = 0;
  }
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_38 = ReduceObjectHelper<unsigned_long>
                         (obj,length,index,(RecyclableObject *)jsReentLock._24_8_,local_38,
                          scriptContext);
  }
  else {
    pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar3) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x27a8,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar3) {
LAB_00bab583:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    uVar13 = (ulong)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar13 < length) {
      length = uVar13;
    }
    if (index < length) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        iVar6 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,index & 0xffffffff);
        *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        this = scriptContext->threadContext;
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        if (index < 0x80000000) {
          uVar13 = index + 0x1000000000000;
        }
        else {
          auVar14._8_4_ = (int)(index >> 0x20);
          auVar14._0_8_ = index;
          auVar14._12_4_ = 0x45300000;
          value = ((double)CONCAT44(0x43300000,(int)index) - 4503599627370496.0) +
                  (auVar14._8_8_ - 1.9342813113834067e+25);
          uVar10 = NumberUtilities::ToSpecial(value);
          bVar4 = NumberUtilities::IsNan(value);
          if (((bVar4) && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000)
              ) && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar4) goto LAB_00bab583;
            *puVar8 = 0;
          }
          uVar13 = uVar10 ^ 0xfffc000000000000;
        }
        local_38 = (*p_Var9)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                             0x2000005,0,0,0,0,0x2000005,pRVar1,local_38,
                             CONCAT44(extraout_var_00,iVar6),uVar13,typedArrayBase);
        this->reentrancySafeOrHandled = bVar3;
        JsReentLock::MutateArrayObject((JsReentLock *)local_70);
        *(bool *)((long)local_70 + 0x108) = true;
        index = index + 1;
      } while (length != index);
    }
  }
  *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_38;
}

Assistant:

Var JavascriptArray::ReduceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduce"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduce"));
            }
        }

        // If we came from Array.prototype.reduce and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        T k = 0;
        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }

            bool bPresent = false;

            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    element = typedArrayBase->DirectGetItem((uint32)k);

                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, k, scriptContext));
                        bPresent = true;
                    }
                }
            }

            if (bPresent == false)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }
        }

        Assert(accumulator);

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem((uint32)k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }